

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O3

Ref<embree::SceneGraph::Node> __thiscall
embree::SceneGraph::convert_quads_to_grids
          (SceneGraph *this,Ref<embree::SceneGraph::Node> *node,uint resX,uint resY)

{
  Node *pNVar1;
  long *plVar2;
  long *plVar3;
  long lVar4;
  QuadMeshNode *pQVar5;
  ulong uVar6;
  long local_60;
  Node *local_58;
  Ref<embree::SceneGraph::Node> local_50;
  Ref<embree::SceneGraph::Node> local_48;
  Ref<embree::SceneGraph::Node> local_40;
  Ref<embree::SceneGraph::QuadMeshNode> local_38;
  
  pNVar1 = node->ptr;
  if (pNVar1 != (Node *)0x0) {
    local_58 = (Node *)this;
    plVar3 = (long *)__dynamic_cast(pNVar1,&Node::typeinfo,&TransformNode::typeinfo,0);
    if (plVar3 == (long *)0x0) {
      plVar3 = (long *)__dynamic_cast(pNVar1,&Node::typeinfo,&MultiTransformNode::typeinfo,0);
      if (plVar3 == (long *)0x0) {
        plVar3 = (long *)__dynamic_cast(pNVar1,&Node::typeinfo,&GroupNode::typeinfo,0);
        if (plVar3 == (long *)0x0) {
          pQVar5 = (QuadMeshNode *)__dynamic_cast(pNVar1,&Node::typeinfo,&QuadMeshNode::typeinfo,0);
          this = (SceneGraph *)local_58;
          if (pQVar5 != (QuadMeshNode *)0x0) {
            (*(pQVar5->super_Node).super_RefCount._vptr_RefCount[2])(pQVar5);
            local_38.ptr = pQVar5;
            (*(pQVar5->super_Node).super_RefCount._vptr_RefCount[2])(pQVar5);
            convert_quads_to_grids((SceneGraph *)local_58,&local_38,resX,resY);
            (*(pQVar5->super_Node).super_RefCount._vptr_RefCount[3])(pQVar5);
            (*(pQVar5->super_Node).super_RefCount._vptr_RefCount[3])(pQVar5);
            return (Ref<embree::SceneGraph::Node>)local_58;
          }
        }
        else {
          (**(code **)(*plVar3 + 0x10))(plVar3);
          lVar4 = plVar3[0xd];
          if (plVar3[0xe] != lVar4) {
            uVar6 = 0;
            do {
              local_50.ptr = *(Node **)(lVar4 + uVar6 * 8);
              if (local_50.ptr != (Node *)0x0) {
                (*((local_50.ptr)->super_RefCount)._vptr_RefCount[2])();
              }
              convert_quads_to_grids((SceneGraph *)&local_60,&local_50,resX,resY);
              lVar4 = plVar3[0xd];
              plVar2 = *(long **)(lVar4 + uVar6 * 8);
              if (plVar2 != (long *)0x0) {
                (**(code **)(*plVar2 + 0x18))();
              }
              *(long *)(lVar4 + uVar6 * 8) = local_60;
              if (local_50.ptr != (Node *)0x0) {
                (*((local_50.ptr)->super_RefCount)._vptr_RefCount[3])();
              }
              uVar6 = uVar6 + 1;
              lVar4 = plVar3[0xd];
            } while (uVar6 < (ulong)(plVar3[0xe] - lVar4 >> 3));
          }
          (**(code **)(*plVar3 + 0x18))(plVar3);
          this = (SceneGraph *)local_58;
        }
      }
      else {
        (**(code **)(*plVar3 + 0x10))(plVar3);
        local_48.ptr = (Node *)plVar3[0x10];
        if (local_48.ptr != (Node *)0x0) {
          (*((local_48.ptr)->super_RefCount)._vptr_RefCount[2])();
        }
        convert_quads_to_grids((SceneGraph *)&local_60,&local_48,resX,resY);
        if ((long *)plVar3[0x10] != (long *)0x0) {
          (**(code **)(*(long *)plVar3[0x10] + 0x18))();
        }
        plVar3[0x10] = local_60;
        if (local_48.ptr != (Node *)0x0) {
          (*((local_48.ptr)->super_RefCount)._vptr_RefCount[3])();
        }
        (**(code **)(*plVar3 + 0x18))(plVar3);
        this = (SceneGraph *)local_58;
      }
    }
    else {
      (**(code **)(*plVar3 + 0x10))(plVar3);
      local_40.ptr = (Node *)plVar3[0x13];
      if (local_40.ptr != (Node *)0x0) {
        (*((local_40.ptr)->super_RefCount)._vptr_RefCount[2])();
      }
      convert_quads_to_grids((SceneGraph *)&local_60,&local_40,resX,resY);
      if ((long *)plVar3[0x13] != (long *)0x0) {
        (**(code **)(*(long *)plVar3[0x13] + 0x18))();
      }
      plVar3[0x13] = local_60;
      if (local_40.ptr != (Node *)0x0) {
        (*((local_40.ptr)->super_RefCount)._vptr_RefCount[3])();
      }
      (**(code **)(*plVar3 + 0x18))(plVar3);
      this = (SceneGraph *)local_58;
    }
  }
  (((Node *)this)->super_RefCount)._vptr_RefCount = (_func_int **)node->ptr;
  node->ptr = (Node *)0x0;
  return (Ref<embree::SceneGraph::Node>)(Node *)this;
}

Assistant:

Ref<SceneGraph::Node> SceneGraph::convert_quads_to_grids(Ref<SceneGraph::Node> node, const unsigned int resX, const unsigned int resY )
  {
    if (Ref<SceneGraph::TransformNode> xfmNode = node.dynamicCast<SceneGraph::TransformNode>()) {
      xfmNode->child = convert_quads_to_grids(xfmNode->child, resX, resY);
    } 
    else if (Ref<SceneGraph::MultiTransformNode> xfmNode = node.dynamicCast<SceneGraph::MultiTransformNode>()) {
      xfmNode->child = convert_quads_to_grids(xfmNode->child, resX, resY);
    }
    else if (Ref<SceneGraph::GroupNode> groupNode = node.dynamicCast<SceneGraph::GroupNode>()) 
    {
      for (size_t i=0; i<groupNode->children.size(); i++) 
        groupNode->children[i] = convert_quads_to_grids(groupNode->children[i], resX, resY);
    }
    else if (Ref<SceneGraph::QuadMeshNode> qmesh = node.dynamicCast<SceneGraph::QuadMeshNode>()) {
      return convert_quads_to_grids(qmesh, resX, resY);
    }
    return node;
  }